

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O3

void __thiscall sjtu::index_out_of_bound::index_out_of_bound(index_out_of_bound *this)

{
  exception::exception(&this->super_exception);
  (this->super_exception)._vptr_exception = (_func_int **)&PTR_what_abi_cxx11__00123900;
  (this->wro)._M_dataplus._M_p = (pointer)&(this->wro).field_2;
  (this->wro)._M_string_length = 0;
  (this->wro).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&this->wro,0,(char *)0x0,0x11d171);
  return;
}

Assistant:

index_out_of_bound() {
	    wro = "index_out_of_bound";
	}